

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall libcellml::Variable::setInitialValue(Variable *this,VariablePtr *variable)

{
  string local_30;
  
  NamedEntity::name_abi_cxx11_
            (&local_30,
             &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity);
  std::__cxx11::string::operator=
            ((string *)
             (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[6].mId.field_2.
             _M_local_buf,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Variable::setInitialValue(const VariablePtr &variable)
{
    pFunc()->mInitialValue = variable->name();
}